

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EfiTianoCompressLegacy.c
# Opt level: O0

void Output(UINT32 CharC,UINT32 Pos)

{
  ulong uVar1;
  uint local_10;
  uint local_c;
  UINT32 Pos_local;
  UINT32 CharC_local;
  
  mOutputMask = mOutputMask >> 1;
  if (mOutputMask == 0) {
    mOutputMask = 0x80;
    if (mBufSiz - 0x28 <= mOutputPos) {
      SendBlock();
      mOutputPos = 0;
    }
    Output::CPos = mOutputPos;
    uVar1 = (ulong)mOutputPos;
    mOutputPos = mOutputPos + 1;
    mBuf[uVar1] = '\0';
  }
  uVar1 = (ulong)mOutputPos;
  mOutputPos = mOutputPos + 1;
  mBuf[uVar1] = (UINT8)CharC;
  mCFreq[CharC] = mCFreq[CharC] + 1;
  if (0xff < CharC) {
    mBuf[Output::CPos] = mBuf[Output::CPos] | (byte)mOutputMask;
    uVar1 = (ulong)mOutputPos;
    mOutputPos = mOutputPos + 1;
    mBuf[uVar1] = (UINT8)(Pos >> 0x18);
    uVar1 = (ulong)mOutputPos;
    mOutputPos = mOutputPos + 1;
    mBuf[uVar1] = (UINT8)(Pos >> 0x10);
    uVar1 = (ulong)mOutputPos;
    mOutputPos = mOutputPos + 1;
    mBuf[uVar1] = (UINT8)(Pos >> 8);
    uVar1 = (ulong)mOutputPos;
    mOutputPos = mOutputPos + 1;
    mBuf[uVar1] = (UINT8)Pos;
    local_c = 0;
    for (local_10 = Pos; local_10 != 0; local_10 = local_10 >> 1) {
      local_c = local_c + 1;
    }
    mPFreq[local_c] = mPFreq[local_c] + 1;
  }
  return;
}

Assistant:

STATIC
  VOID
  Output (
  UINT32 CharC,
  UINT32 Pos
  )
  /*++

  Routine Description:

  Outputs an Original Character or a Pointer

  Arguments:

  CharC     - The original character or the 'String Length' element of a Pointer
  Pos     - The 'Position' field of a Pointer

  Returns: (VOID)

  --*/
{
  STATIC UINT32 CPos;

  if ((mOutputMask >>= 1) == 0) {
    mOutputMask = 1U << (UINT8_BIT - 1);
    //
    // Check the buffer overflow per outputting UINT8_BIT symbols
    // which is an Original Character or a Pointer. The biggest
    // symbol is a Pointer which occupies 5 bytes.
    //
    if (mOutputPos >= mBufSiz - 5 * UINT8_BIT) {
      SendBlock ();
      mOutputPos = 0;
    }

    CPos        = mOutputPos++;
    mBuf[CPos]  = 0;
  }

  mBuf[mOutputPos++] = (UINT8) CharC;
  mCFreq[CharC]++;
  if (CharC >= (1U << UINT8_BIT)) {
    mBuf[CPos] |= mOutputMask;
    mBuf[mOutputPos++]  = (UINT8) (Pos >> 24);
    mBuf[mOutputPos++]  = (UINT8) (Pos >> 16);
    mBuf[mOutputPos++]  = (UINT8) (Pos >> (UINT8_BIT));
    mBuf[mOutputPos++]  = (UINT8) Pos;
    CharC               = 0;
    while (Pos) {
      Pos >>= 1;
      CharC++;
    }

    mPFreq[CharC]++;
  }
}